

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::BatchnormLayerParams::ByteSizeLong(BatchnormLayerParams *this)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (this->gamma_ == (WeightParams *)0x0 ||
      this == (BatchnormLayerParams *)_BatchnormLayerParams_default_instance_) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::WeightParams>(this->gamma_);
    sVar2 = sVar2 + 1;
  }
  if (this->beta_ != (WeightParams *)0x0 &&
      this != (BatchnormLayerParams *)_BatchnormLayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::WeightParams>(this->beta_);
    sVar2 = sVar2 + sVar3 + 2;
  }
  if (this->mean_ != (WeightParams *)0x0 &&
      this != (BatchnormLayerParams *)_BatchnormLayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::WeightParams>(this->mean_);
    sVar2 = sVar2 + sVar3 + 2;
  }
  if (this->variance_ != (WeightParams *)0x0 &&
      this != (BatchnormLayerParams *)_BatchnormLayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::WeightParams>(this->variance_);
    sVar2 = sVar2 + sVar3 + 2;
  }
  if (this->channels_ != 0) {
    uVar4 = this->channels_ | 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar1 * 9 + 0x89U >> 6);
  }
  sVar3 = sVar2 + 2;
  if (this->computemeanvar_ == false) {
    sVar3 = sVar2;
  }
  sVar2 = sVar3 + 2;
  if (this->instancenormalization_ == false) {
    sVar2 = sVar3;
  }
  sVar3 = sVar2 + 5;
  if (this->epsilon_ == 0.0) {
    sVar3 = sVar2;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

size_t BatchnormLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BatchnormLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // .CoreML.Specification.WeightParams gamma = 15;
  if (this->_internal_has_gamma()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *gamma_);
  }

  // .CoreML.Specification.WeightParams beta = 16;
  if (this->_internal_has_beta()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *beta_);
  }

  // .CoreML.Specification.WeightParams mean = 17;
  if (this->_internal_has_mean()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *mean_);
  }

  // .CoreML.Specification.WeightParams variance = 18;
  if (this->_internal_has_variance()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *variance_);
  }

  // uint64 channels = 1;
  if (this->_internal_channels() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_channels());
  }

  // bool computeMeanVar = 5;
  if (this->_internal_computemeanvar() != 0) {
    total_size += 1 + 1;
  }

  // bool instanceNormalization = 6;
  if (this->_internal_instancenormalization() != 0) {
    total_size += 1 + 1;
  }

  // float epsilon = 10;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_epsilon = this->_internal_epsilon();
  uint32_t raw_epsilon;
  memcpy(&raw_epsilon, &tmp_epsilon, sizeof(tmp_epsilon));
  if (raw_epsilon != 0) {
    total_size += 1 + 4;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}